

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O2

Error __thiscall
llvm::DWARFDebugLine::Prologue::parse
          (Prologue *this,DWARFDataExtractor *DebugLineData,uint64_t *OffsetPtr,DWARFContext *Ctx,
          DWARFUnit *U)

{
  vector<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_> *this_00;
  DIContextKind DVar1;
  DWARFUnit *this_01;
  uint8_t uVar2;
  byte bVar3;
  bool bVar4;
  uint16_t uVar5;
  char *pcVar6;
  uint64_t uVar7;
  ulong uVar8;
  ArrayRef<unsigned_char> *pAVar9;
  Prologue *pPVar10;
  DWARFUnit *in_R9;
  uint32_t I;
  uint uVar11;
  long lVar12;
  int *piVar13;
  StringRef SVar14;
  Optional<unsigned_long> OVar15;
  error_code EC;
  error_code EC_00;
  error_code EC_01;
  error_code EC_02;
  error_code EC_03;
  error_code EC_04;
  error_code EC_05;
  error_code EC_06;
  OptionalStorage<llvm::ArrayRef<unsigned_char>,_true> local_200;
  undefined1 local_1e8 [8];
  Expected<llvm::SmallVector<(anonymous_namespace)::ContentDescriptor,_4U>_> FileDescriptors;
  Expected<llvm::SmallVector<(anonymous_namespace)::ContentDescriptor,_4U>_> DirDescriptors;
  uint8_t OpLen;
  undefined1 auStack_e0 [8];
  DWARFFormValue Value_1;
  uint64_t EndPrologueOffset;
  DWARFUnit *local_a0;
  anon_union_16_2_fc7899a5_for_OptionalStorage<llvm::ArrayRef<unsigned_char>,_true>_2 local_98;
  char local_88;
  Error local_80;
  ulong local_78;
  _func_int **local_70;
  uint64_t PrologueOffset;
  DWARFUnit *local_60;
  char local_58 [8];
  Prologue *local_50;
  uint local_44;
  AlignedCharArrayUnion<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_>
  local_40;
  undefined8 local_38;
  Error e;
  
  local_70 = (Ctx->super_DIContext)._vptr_DIContext;
  local_a0 = U;
  local_60 = in_R9;
  local_50 = this;
  clear((Prologue *)DebugLineData);
  pcVar6 = (char *)DWARFDataExtractor::getRelocatedValue
                             ((DWARFDataExtractor *)OffsetPtr,4,(uint64_t *)Ctx,(uint64_t *)0x0,
                              (Error *)0x0);
  (DebugLineData->super_DataExtractor).Data.Data = pcVar6;
  if (pcVar6 == (char *)0xffffffff) {
    *(undefined1 *)((long)&(DebugLineData->super_DataExtractor).Data.Length + 3) = 1;
    pcVar6 = (char *)DataExtractor::getU64((DataExtractor *)OffsetPtr,(uint64_t *)Ctx,(Error *)0x0);
    (DebugLineData->super_DataExtractor).Data.Data = pcVar6;
  }
  else if (0xffffffe < (ulong)pcVar6 >> 4) {
    pcVar6 = (char *)std::_V2::generic_category();
    pPVar10 = local_50;
    EC._M_cat = (error_category *)0x16;
    EC._0_8_ = local_50;
    createStringError<unsigned_long,unsigned_long>
              (EC,pcVar6,
               (unsigned_long *)
               "parsing line table prologue at offset 0x%8.8lx unsupported reserved unit length found of value 0x%8.8lx"
               ,(unsigned_long *)&local_70);
    return (Error)(ErrorInfoBase *)pPVar10;
  }
  uVar5 = DataExtractor::getU16((DataExtractor *)OffsetPtr,(uint64_t *)Ctx,(Error *)0x0);
  *(uint16_t *)&(DebugLineData->super_DataExtractor).Data.Length = uVar5;
  if (uVar5 < 2) {
    pcVar6 = (char *)std::_V2::generic_category();
    pPVar10 = local_50;
    DirDescriptors._48_2_ = uVar5;
    EC_00._M_cat = (error_category *)0x5f;
    EC_00._0_8_ = local_50;
    createStringError<unsigned_long,unsigned_short>
              (EC_00,pcVar6,
               (unsigned_long *)
               "parsing line table prologue at offset 0x%8.8lx found unsupported version 0x%2.2x",
               (unsigned_short *)&local_70);
    return (Error)(ErrorInfoBase *)pPVar10;
  }
  if (4 < uVar5) {
    uVar2 = DataExtractor::getU8((DataExtractor *)OffsetPtr,(uint64_t *)Ctx,(Error *)0x0);
    *(uint8_t *)((long)&(DebugLineData->super_DataExtractor).Data.Length + 2) = uVar2;
    if (*(uint8_t *)((long)OffsetPtr + 0x11) != '\0' &&
        *(uint8_t *)((long)OffsetPtr + 0x11) != uVar2) {
      __assert_fail("(DebugLineData.getAddressSize() == 0 || DebugLineData.getAddressSize() == getAddressSize()) && \"Line table header and data extractor disagree\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/DWARFDebugLine.cpp"
                    ,0x162,
                    "Error llvm::DWARFDebugLine::Prologue::parse(const DWARFDataExtractor &, uint64_t *, const DWARFContext &, const DWARFUnit *)"
                   );
    }
    uVar2 = DataExtractor::getU8((DataExtractor *)OffsetPtr,(uint64_t *)Ctx,(Error *)0x0);
    *(uint8_t *)&DebugLineData->Obj = uVar2;
  }
  uVar7 = DWARFDataExtractor::getRelocatedValue
                    ((DWARFDataExtractor *)OffsetPtr,
                     (uint)(*(char *)((long)&(DebugLineData->super_DataExtractor).Data.Length + 3)
                           == '\x01') * 4 + 4,(uint64_t *)Ctx,(uint64_t *)0x0,(Error *)0x0);
  (DebugLineData->super_DataExtractor).IsLittleEndian = (char)uVar7;
  (DebugLineData->super_DataExtractor).AddressSize = (char)(uVar7 >> 8);
  *(int6 *)&(DebugLineData->super_DataExtractor).field_0x12 = (int6)(uVar7 >> 0x10);
  Value_1.C = (DWARFContext *)(uVar7 + (long)(Ctx->super_DIContext)._vptr_DIContext);
  local_40.buffer = (char  [8])Value_1.C;
  uVar2 = DataExtractor::getU8((DataExtractor *)OffsetPtr,(uint64_t *)Ctx,(Error *)0x0);
  *(uint8_t *)((long)&DebugLineData->Obj + 1) = uVar2;
  if (3 < (ushort)(DebugLineData->super_DataExtractor).Data.Length) {
    uVar2 = DataExtractor::getU8((DataExtractor *)OffsetPtr,(uint64_t *)Ctx,(Error *)0x0);
    *(uint8_t *)((long)&DebugLineData->Obj + 2) = uVar2;
  }
  uVar2 = DataExtractor::getU8((DataExtractor *)OffsetPtr,(uint64_t *)Ctx,(Error *)0x0);
  *(uint8_t *)((long)&DebugLineData->Obj + 3) = uVar2;
  uVar2 = DataExtractor::getU8((DataExtractor *)OffsetPtr,(uint64_t *)Ctx,(Error *)0x0);
  *(uint8_t *)((long)&DebugLineData->Obj + 4) = uVar2;
  uVar2 = DataExtractor::getU8((DataExtractor *)OffsetPtr,(uint64_t *)Ctx,(Error *)0x0);
  *(uint8_t *)((long)&DebugLineData->Obj + 5) = uVar2;
  bVar3 = DataExtractor::getU8((DataExtractor *)OffsetPtr,(uint64_t *)Ctx,(Error *)0x0);
  *(byte *)((long)&DebugLineData->Obj + 6) = bVar3;
  PrologueOffset = (uint64_t)DebugLineData;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(DebugLineData + 1),
             (ulong)bVar3 - 1);
  for (uVar11 = 1; uVar7 = PrologueOffset, uVar11 < *(byte *)(PrologueOffset + 0x1e);
      uVar11 = uVar11 + 1) {
    uVar2 = DataExtractor::getU8((DataExtractor *)OffsetPtr,(uint64_t *)Ctx,(Error *)0x0);
    DirDescriptors._48_1_ = uVar2;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(DebugLineData + 1),
               &DirDescriptors.field_0x30);
  }
  if (*(ushort *)(PrologueOffset + 8) < 5) {
    this_00 = (vector<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_> *)
              (PrologueOffset + 0x40);
    local_60 = (DWARFUnit *)(PrologueOffset + 0x58);
    while (this_01 = local_60, (Ctx->super_DIContext)._vptr_DIContext < (ulong)local_40.buffer) {
      SVar14 = DataExtractor::getCStrRef((DataExtractor *)OffsetPtr,(uint64_t *)Ctx);
      this_01 = local_60;
      if (SVar14.Length == 0) break;
      DWARFFormValue::createFromPValue(DW_FORM_string,SVar14.Data);
      std::vector<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>::push_back
                (this_00,(value_type *)&DirDescriptors.field_0x30);
    }
    do {
      if ((ulong)local_40.buffer <= (Ctx->super_DIContext)._vptr_DIContext) goto LAB_00b3303e;
      SVar14 = DataExtractor::getCStrRef((DataExtractor *)OffsetPtr,(uint64_t *)Ctx);
      if (SVar14.Length == 0) goto LAB_00b3303e;
      DirDescriptors._48_8_ = DirDescriptors._48_8_ & 0xffffffffffff0000;
      DWARFFormValue::createFromPValue(DW_FORM_string,SVar14.Data);
      DirDescriptors._48_8_ = FileDescriptors._48_8_;
      DataExtractor::getULEB128((DataExtractor *)OffsetPtr,(uint64_t *)Ctx,(Error *)0x0);
      DataExtractor::getULEB128((DataExtractor *)OffsetPtr,(uint64_t *)Ctx,(Error *)0x0);
      DataExtractor::getULEB128((DataExtractor *)OffsetPtr,(uint64_t *)Ctx,(Error *)0x0);
      std::
      vector<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
      ::push_back((vector<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
                   *)this_01,(value_type *)&DirDescriptors.field_0x30);
    } while( true );
  }
  local_58[0] = local_40.buffer[0];
  local_58[1] = local_40.buffer[1];
  local_58[2] = local_40.buffer[2];
  local_58[3] = local_40.buffer[3];
  local_58[4] = local_40.buffer[4];
  local_58[5] = local_40.buffer[5];
  local_58[6] = local_40.buffer[6];
  local_58[7] = local_40.buffer[7];
  parseV5EntryFormat((Expected<llvm::SmallVector<(anonymous_namespace)::ContentDescriptor,_4U>_> *)
                     &FileDescriptors.field_0x30,(DWARFDataExtractor *)OffsetPtr,(uint64_t *)Ctx,
                     (uint64_t)local_40.buffer,(ContentTypeTracker *)0x0);
  if ((DirDescriptors.field_0.TStorage.buffer[0x28] & 1U) == 0) {
    bVar3 = DataExtractor::getU8((DataExtractor *)OffsetPtr,(uint64_t *)Ctx,(Error *)0x0);
    local_40.buffer = (char  [8])(uVar7 + 0x40);
    local_44 = (uint)bVar3;
    uVar8 = 0;
    while ((uint)uVar8 != local_44) {
      if ((ulong)local_58 <= (Ctx->super_DIContext)._vptr_DIContext) {
        pcVar6 = (char *)std::_V2::generic_category();
        EC_04._M_cat = (error_category *)0x16;
        EC_04._0_8_ = &local_38;
        createStringError<unsigned_long,unsigned_long>
                  (EC_04,pcVar6,
                   (unsigned_long *)
                   "failed to parse directory entry at offset 0x%8.8lx because offset extends beyond the prologue end at offset 0x%8.8lx"
                   ,(unsigned_long *)Ctx);
        goto LAB_00b3318b;
      }
      local_78 = uVar8;
      Expected<llvm::SmallVector<(anonymous_namespace)::ContentDescriptor,_4U>_>::getStorage
                ((Expected<llvm::SmallVector<(anonymous_namespace)::ContentDescriptor,_4U>_> *)
                 &FileDescriptors.field_0x30);
      piVar13 = (int *)FileDescriptors._48_8_;
      for (lVar12 = (ulong)(uint)DirDescriptors.field_0._0_4_ << 3; lVar12 != 0;
          lVar12 = lVar12 + -8) {
        DirDescriptors._48_2_ = *(Form *)(piVar13 + 1);
        if (*piVar13 == 1) {
          bVar4 = DWARFFormValue::extractValue
                            ((DWARFFormValue *)&DirDescriptors.field_0x30,
                             (DWARFDataExtractor *)OffsetPtr,(uint64_t *)Ctx,
                             *(FormParams *)(PrologueOffset + 8),(DWARFContext *)local_a0,local_60);
          if (!bVar4) {
LAB_00b33174:
            pcVar6 = (char *)std::_V2::generic_category();
            EC_01._M_cat = (error_category *)0x16;
            EC_01._0_8_ = &local_38;
            createStringError(EC_01,pcVar6);
            goto LAB_00b3318b;
          }
          std::vector<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>::push_back
                    ((vector<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_> *)
                     local_40.buffer,(value_type *)&DirDescriptors.field_0x30);
        }
        else {
          bVar4 = DWARFFormValue::skipValue
                            (*(Form *)(piVar13 + 1),*(DataExtractor *)OffsetPtr,(uint64_t *)Ctx,
                             *(FormParams *)(PrologueOffset + 8));
          if (!bVar4) goto LAB_00b33174;
        }
        piVar13 = piVar13 + 2;
      }
      uVar8 = (ulong)((int)local_78 + 1);
    }
    parseV5EntryFormat((Expected<llvm::SmallVector<(anonymous_namespace)::ContentDescriptor,_4U>_> *
                       )local_1e8,(DWARFDataExtractor *)OffsetPtr,(uint64_t *)Ctx,(uint64_t)local_58
                       ,(ContentTypeTracker *)(uVar7 + 0x1f));
    if ((FileDescriptors.field_0.TStorage.buffer[0x28] & 1U) == 0) {
      bVar3 = DataExtractor::getU8((DataExtractor *)OffsetPtr,(uint64_t *)Ctx,(Error *)0x0);
      local_44 = (uint)bVar3;
      uVar8 = 0;
      while ((uint)uVar8 != local_44) {
        if ((ulong)local_58 <= (Ctx->super_DIContext)._vptr_DIContext) {
          pcVar6 = (char *)std::_V2::generic_category();
          EC_06._M_cat = (error_category *)0x16;
          EC_06._0_8_ = &local_38;
          createStringError<unsigned_long,unsigned_long>
                    (EC_06,pcVar6,
                     (unsigned_long *)
                     "failed to parse file entry at offset 0x%8.8lx because offset extends beyond the prologue end at offset 0x%8.8lx"
                     ,(unsigned_long *)Ctx);
          goto LAB_00b335cd;
        }
        DirDescriptors._48_8_ = DirDescriptors._48_8_ & 0xffffffffffff0000;
        local_78 = uVar8;
        Expected<llvm::SmallVector<(anonymous_namespace)::ContentDescriptor,_4U>_>::getStorage
                  ((Expected<llvm::SmallVector<(anonymous_namespace)::ContentDescriptor,_4U>_> *)
                   local_1e8);
        local_40.buffer[0] = local_1e8[0];
        local_40.buffer[1] = local_1e8[1];
        local_40.buffer[2] = local_1e8[2];
        local_40.buffer[3] = local_1e8[3];
        local_40.buffer[4] = local_1e8[4];
        local_40.buffer[5] = local_1e8[5];
        local_40.buffer[6] = local_1e8[6];
        local_40.buffer[7] = local_1e8[7];
        for (lVar12 = (ulong)(uint)FileDescriptors.field_0._0_4_ << 3; lVar12 != 0;
            lVar12 = lVar12 + -8) {
          DVar1 = *(DIContextKind *)local_40.buffer;
          auStack_e0._0_2_ = *(Form *)((long)local_40.buffer + 4);
          Value_1.Form = 0;
          Value_1._2_6_ = 0;
          Value_1.Value.field_0.uval = 0;
          Value_1.Value.SectionIndex = 0;
          Value_1.U = (DWARFUnit *)0x0;
          bVar4 = DWARFFormValue::extractValue
                            ((DWARFFormValue *)auStack_e0,(DWARFDataExtractor *)OffsetPtr,
                             (uint64_t *)Ctx,*(FormParams *)(PrologueOffset + 8),
                             (DWARFContext *)local_a0,local_60);
          if (!bVar4) {
LAB_00b335b6:
            pcVar6 = (char *)std::_V2::generic_category();
            EC_05._M_cat = (error_category *)0x16;
            EC_05._0_8_ = &local_38;
            createStringError(EC_05,pcVar6);
            goto LAB_00b335cd;
          }
          switch(DVar1) {
          case CK_PDB:
            DirDescriptors._50_6_ = auStack_e0._2_6_;
            DirDescriptors._48_2_ = auStack_e0._0_2_;
            break;
          case 2:
            OVar15 = DWARFFormValue::getAsUnsignedConstant((DWARFFormValue *)auStack_e0);
            local_98.value.Data = (uchar *)OVar15.Storage.field_0;
            local_98.value.Length._0_1_ = OVar15.Storage.hasVal;
            optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                      ((OptionalStorage<unsigned_long,_true> *)&local_98.value);
            break;
          case 3:
            OVar15 = DWARFFormValue::getAsUnsignedConstant((DWARFFormValue *)auStack_e0);
            local_98.value.Data = (uchar *)OVar15.Storage.field_0;
            local_98.value.Length._0_1_ = OVar15.Storage.hasVal;
            optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                      ((OptionalStorage<unsigned_long,_true> *)&local_98.value);
            break;
          case 4:
            OVar15 = DWARFFormValue::getAsUnsignedConstant((DWARFFormValue *)auStack_e0);
            local_98.value.Data = (uchar *)OVar15.Storage.field_0;
            local_98.value.Length._0_1_ = OVar15.Storage.hasVal;
            optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                      ((OptionalStorage<unsigned_long,_true> *)&local_98.value);
            break;
          case 5:
            DWARFFormValue::getAsBlock
                      ((Optional<llvm::ArrayRef<unsigned_char>_> *)&local_98.value,
                       (DWARFFormValue *)auStack_e0);
            if (local_88 == '\x01') {
              DWARFFormValue::getAsBlock
                        ((Optional<llvm::ArrayRef<unsigned_char>_> *)&local_200,
                         (DWARFFormValue *)auStack_e0);
              pAVar9 = optional_detail::OptionalStorage<llvm::ArrayRef<unsigned_char>,_true>::
                       getValue(&local_200);
              if (pAVar9->Length == 0x10) {
                DWARFFormValue::getAsBlock
                          ((Optional<llvm::ArrayRef<unsigned_char>_> *)&local_98.value,
                           (DWARFFormValue *)auStack_e0);
                optional_detail::OptionalStorage<llvm::ArrayRef<unsigned_char>,_true>::getValue
                          ((OptionalStorage<llvm::ArrayRef<unsigned_char>,_true> *)&local_98.value);
                break;
              }
            }
            goto LAB_00b335b6;
          default:
          }
          local_40.buffer = local_40.buffer + 8;
        }
        std::
        vector<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
        ::push_back((vector<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
                     *)(uVar7 + 0x58),(value_type *)&DirDescriptors.field_0x30);
        uVar8 = (ulong)((int)local_78 + 1);
      }
      local_38 = (char  [8])0x1;
    }
    else {
      Expected<llvm::SmallVector<(anonymous_namespace)::ContentDescriptor,_4U>_>::takeError
                ((Expected<llvm::SmallVector<(anonymous_namespace)::ContentDescriptor,_4U>_> *)
                 &local_38);
    }
LAB_00b335cd:
    Expected<llvm::SmallVector<(anonymous_namespace)::ContentDescriptor,_4U>_>::~Expected
              ((Expected<llvm::SmallVector<(anonymous_namespace)::ContentDescriptor,_4U>_> *)
               local_1e8);
  }
  else {
    Expected<llvm::SmallVector<(anonymous_namespace)::ContentDescriptor,_4U>_>::takeError
              ((Expected<llvm::SmallVector<(anonymous_namespace)::ContentDescriptor,_4U>_> *)
               &local_38);
  }
LAB_00b3318b:
  Expected<llvm::SmallVector<(anonymous_namespace)::ContentDescriptor,_4U>_>::~Expected
            ((Expected<llvm::SmallVector<(anonymous_namespace)::ContentDescriptor,_4U>_> *)
             &FileDescriptors.field_0x30);
  uVar8 = local_38 & 0xfffffffffffffffe;
  local_38 = uVar8 != 0 | uVar8;
  if (uVar8 != 0) {
    pcVar6 = (char *)std::_V2::generic_category();
    EC_02._M_cat = (error_category *)0x16;
    EC_02._0_8_ = &local_80;
    createStringError<unsigned_long,unsigned_long>
              (EC_02,pcVar6,
               (unsigned_long *)
               "parsing line table prologue at 0x%8.8lx found an invalid directory or file table description at 0x%8.8lx"
               ,(unsigned_long *)&local_70);
    pPVar10 = local_50;
    EndPrologueOffset = local_38 | 1;
    local_38 = (char  [8])0x0;
    joinErrors((llvm *)local_50,&local_80,(Error *)&EndPrologueOffset);
    if ((long *)(EndPrologueOffset & 0xfffffffffffffffe) != (long *)0x0) {
      (**(code **)(*(long *)(EndPrologueOffset & 0xfffffffffffffffe) + 8))();
    }
    if ((long *)((ulong)local_80.Payload & 0xfffffffffffffffe) != (long *)0x0) {
      (**(code **)(*(long *)((ulong)local_80.Payload & 0xfffffffffffffffe) + 8))();
    }
    if ((long *)(local_38 & 0xfffffffffffffffe) == (long *)0x0) {
      return (Error)(ErrorInfoBase *)pPVar10;
    }
    (**(code **)(*(long *)(local_38 & 0xfffffffffffffffe) + 8))();
    return (Error)(ErrorInfoBase *)pPVar10;
  }
LAB_00b3322e:
  if ((DWARFContext *)(Ctx->super_DIContext)._vptr_DIContext == Value_1.C) {
    local_50->TotalLength = 1;
    pPVar10 = local_50;
  }
  else {
    pcVar6 = (char *)std::_V2::generic_category();
    pPVar10 = local_50;
    EC_03._M_cat = (error_category *)0x16;
    EC_03._0_8_ = local_50;
    createStringError<unsigned_long,unsigned_long,unsigned_long>
              (EC_03,pcVar6,
               (unsigned_long *)
               "parsing line table prologue at 0x%8.8lx should have ended at 0x%8.8lx but it ended at 0x%8.8lx"
               ,(unsigned_long *)&local_70,(unsigned_long *)&Value_1.C);
  }
  return (Error)(ErrorInfoBase *)pPVar10;
LAB_00b3303e:
  *(undefined2 *)(uVar7 + 0x1f) = 0x101;
  goto LAB_00b3322e;
}

Assistant:

Error DWARFDebugLine::Prologue::parse(const DWARFDataExtractor &DebugLineData,
                                      uint64_t *OffsetPtr,
                                      const DWARFContext &Ctx,
                                      const DWARFUnit *U) {
  const uint64_t PrologueOffset = *OffsetPtr;

  clear();
  TotalLength = DebugLineData.getRelocatedValue(4, OffsetPtr);
  if (TotalLength == dwarf::DW_LENGTH_DWARF64) {
    FormParams.Format = dwarf::DWARF64;
    TotalLength = DebugLineData.getU64(OffsetPtr);
  } else if (TotalLength >= dwarf::DW_LENGTH_lo_reserved) {
    return createStringError(errc::invalid_argument,
        "parsing line table prologue at offset 0x%8.8" PRIx64
        " unsupported reserved unit length found of value 0x%8.8" PRIx64,
        PrologueOffset, TotalLength);
  }
  FormParams.Version = DebugLineData.getU16(OffsetPtr);
  if (getVersion() < 2)
    return createStringError(errc::not_supported,
                       "parsing line table prologue at offset 0x%8.8" PRIx64
                       " found unsupported version 0x%2.2" PRIx16,
                       PrologueOffset, getVersion());

  if (getVersion() >= 5) {
    FormParams.AddrSize = DebugLineData.getU8(OffsetPtr);
    assert((DebugLineData.getAddressSize() == 0 ||
            DebugLineData.getAddressSize() == getAddressSize()) &&
           "Line table header and data extractor disagree");
    SegSelectorSize = DebugLineData.getU8(OffsetPtr);
  }

  PrologueLength =
      DebugLineData.getRelocatedValue(sizeofPrologueLength(), OffsetPtr);
  const uint64_t EndPrologueOffset = PrologueLength + *OffsetPtr;
  MinInstLength = DebugLineData.getU8(OffsetPtr);
  if (getVersion() >= 4)
    MaxOpsPerInst = DebugLineData.getU8(OffsetPtr);
  DefaultIsStmt = DebugLineData.getU8(OffsetPtr);
  LineBase = DebugLineData.getU8(OffsetPtr);
  LineRange = DebugLineData.getU8(OffsetPtr);
  OpcodeBase = DebugLineData.getU8(OffsetPtr);

  StandardOpcodeLengths.reserve(OpcodeBase - 1);
  for (uint32_t I = 1; I < OpcodeBase; ++I) {
    uint8_t OpLen = DebugLineData.getU8(OffsetPtr);
    StandardOpcodeLengths.push_back(OpLen);
  }

  if (getVersion() >= 5) {
    if (Error e = parseV5DirFileTables(
            DebugLineData, OffsetPtr, EndPrologueOffset, FormParams, Ctx, U,
            ContentTypes, IncludeDirectories, FileNames)) {
      return joinErrors(
          createStringError(
              errc::invalid_argument,
              "parsing line table prologue at 0x%8.8" PRIx64
              " found an invalid directory or file table description at"
              " 0x%8.8" PRIx64,
              PrologueOffset, *OffsetPtr),
          std::move(e));
    }
  } else
    parseV2DirFileTables(DebugLineData, OffsetPtr, EndPrologueOffset,
                         ContentTypes, IncludeDirectories, FileNames);

  if (*OffsetPtr != EndPrologueOffset)
    return createStringError(errc::invalid_argument,
                       "parsing line table prologue at 0x%8.8" PRIx64
                       " should have ended at 0x%8.8" PRIx64
                       " but it ended at 0x%8.8" PRIx64,
                       PrologueOffset, EndPrologueOffset, *OffsetPtr);
  return Error::success();
}